

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sLongRunningShaderTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Stress::anon_unknown_1::LongRunningShaderCase::init
          (LongRunningShaderCase *this,EVP_PKEY_CTX *ctx)

{
  undefined1 *puVar1;
  ShaderType SVar2;
  IterCountType IVar3;
  RenderContext *renderCtx;
  Params *pPVar4;
  int extraout_EAX;
  ShaderProgram *this_00;
  ostream *poVar5;
  ProgramSources *pPVar6;
  MessageBuilder *pMVar7;
  TestError *this_01;
  char *pcVar8;
  ostringstream *poVar9;
  undefined1 local_558 [40];
  string local_530;
  string local_510;
  undefined1 local_4f0 [40];
  string iterCount;
  ostringstream vert;
  ostringstream frag;
  ProgramSources local_100;
  
  this_00 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  pPVar4 = this->m_params;
  SVar2 = pPVar4->shaderType;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&vert);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&frag);
  poVar5 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                           "#version 300 es\n");
  std::operator<<(poVar5,"in highp vec2 a_position;\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"#version 300 es\n");
  if (pPVar4->iterCountType == ITERCOUNTTYPE_UNIFORM) {
    poVar9 = &vert;
    if (SVar2 != SHADERTYPE_VERTEX) {
      poVar9 = &frag;
    }
    std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,
                    "uniform highp int u_iterCount;\n");
LAB_011c1003:
    if (SVar2 != SHADERTYPE_VERTEX) goto LAB_011c102f;
LAB_011c1007:
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                    "out mediump vec4 v_color;\n");
    pcVar8 = "in mediump vec4 v_color;\n";
  }
  else {
    if (pPVar4->iterCountType != ITERCOUNTTYPE_DYNAMIC) goto LAB_011c1003;
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                    "in highp int a_iterCount;\n");
    if (SVar2 == SHADERTYPE_VERTEX) goto LAB_011c1007;
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                    "flat out highp int v_iterCount;\n");
    pcVar8 = "flat in highp int v_iterCount;\n";
  }
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
LAB_011c102f:
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,
                  "out mediump vec4 o_color;\n");
  poVar5 = std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                           "\nvoid main (void)\n{\n");
  poVar5 = std::operator<<(poVar5,"\tgl_Position = vec4(a_position, 0.0, 1.0);\n");
  std::operator<<(poVar5,"\tgl_PointSize = 1.0;\n");
  if ((SVar2 != SHADERTYPE_VERTEX) && (pPVar4->iterCountType == ITERCOUNTTYPE_DYNAMIC)) {
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,
                    "\tv_iterCount = a_iterCount;\n");
  }
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"\nvoid main (void)\n{\n"
                 );
  IVar3 = pPVar4->iterCountType;
  if (IVar3 == ITERCOUNTTYPE_STATIC) {
    de::toString<int>(&iterCount,&pPVar4->maxLoopIterCount);
  }
  else if (IVar3 == ITERCOUNTTYPE_UNIFORM) {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterCount,"u_iterCount",(allocator<char> *)local_558);
  }
  else if (IVar3 == ITERCOUNTTYPE_DYNAMIC) {
    pcVar8 = "a_iterCount";
    if (SVar2 != SHADERTYPE_VERTEX) {
      pcVar8 = "v_iterCount";
    }
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterCount,pcVar8,(allocator<char> *)local_558);
  }
  else {
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&iterCount,"<invalid>",(allocator<char> *)local_558);
  }
  poVar9 = &vert;
  if (SVar2 != SHADERTYPE_VERTEX) {
    poVar9 = &frag;
  }
  poVar5 = std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,
                           "\tmediump vec4 color = ");
  pcVar8 = "a_position.xyxy";
  if (SVar2 != SHADERTYPE_VERTEX) {
    pcVar8 = "gl_FragCoord";
  }
  poVar5 = std::operator<<(poVar5,pcVar8);
  std::operator<<(poVar5,";\n");
  if (pPVar4->loopType == LOOPTYPE_WHILE) {
    poVar5 = std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\thighp int i = 0;\n");
    poVar5 = std::operator<<(poVar5,"\twhile (i < ");
    poVar5 = std::operator<<(poVar5,(string *)&iterCount);
    poVar5 = std::operator<<(poVar5," || ");
    poVar5 = std::operator<<(poVar5,(string *)&iterCount);
    poVar5 = std::operator<<(poVar5," < 0) {\n");
    poVar5 = std::operator<<(poVar5,"\t\ti += 1;\n");
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,"color = cos(sin(color*1.25)*0.8);");
    poVar5 = std::operator<<(poVar5,"\n");
    pcVar8 = "\t}\n";
  }
  else if (pPVar4->loopType == LOOPTYPE_FOR) {
    poVar5 = std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\tfor (highp int i = 0; i < ");
    poVar5 = std::operator<<(poVar5,(string *)&iterCount);
    poVar5 = std::operator<<(poVar5," || ");
    poVar5 = std::operator<<(poVar5,(string *)&iterCount);
    poVar5 = std::operator<<(poVar5," < 0; ++i)\n");
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,"color = cos(sin(color*1.25)*0.8);");
    pcVar8 = "\n";
  }
  else {
    poVar5 = std::operator<<(&poVar9->super_basic_ostream<char,_std::char_traits<char>_>,
                             "\thighp int i = 0;\n");
    poVar5 = std::operator<<(poVar5,"\tdo {\n");
    poVar5 = std::operator<<(poVar5,"\t\ti += 1;\n");
    poVar5 = std::operator<<(poVar5,"\t\t");
    poVar5 = std::operator<<(poVar5,"color = cos(sin(color*1.25)*0.8);");
    poVar5 = std::operator<<(poVar5,"\n");
    poVar5 = std::operator<<(poVar5,"\t} while (i <= ");
    poVar5 = std::operator<<(poVar5,(string *)&iterCount);
    poVar5 = std::operator<<(poVar5," || ");
    poVar5 = std::operator<<(poVar5,(string *)&iterCount);
    pcVar8 = " < 0);\n";
  }
  std::operator<<(poVar5,pcVar8);
  std::__cxx11::string::~string((string *)&iterCount);
  if (SVar2 == SHADERTYPE_VERTEX) {
    std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"\tv_color = color;\n")
    ;
    pcVar8 = "\to_color = v_color;\n";
  }
  else {
    pcVar8 = "\to_color = color;\n";
  }
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,pcVar8);
  std::operator<<(&vert.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  std::operator<<(&frag.super_basic_ostream<char,_std::char_traits<char>_>,"}\n");
  memset(&iterCount,0,0xac);
  std::__cxx11::stringbuf::str();
  glu::VertexSource::VertexSource((VertexSource *)local_558,&local_510);
  pPVar6 = glu::ProgramSources::operator<<((ProgramSources *)&iterCount,(ShaderSource *)local_558);
  std::__cxx11::stringbuf::str();
  glu::FragmentSource::FragmentSource((FragmentSource *)local_4f0,&local_530);
  pPVar6 = glu::ProgramSources::operator<<(pPVar6,(ShaderSource *)local_4f0);
  glu::ProgramSources::ProgramSources(&local_100,pPVar6);
  std::__cxx11::string::~string((string *)(local_4f0 + 8));
  std::__cxx11::string::~string((string *)&local_530);
  std::__cxx11::string::~string((string *)(local_558 + 8));
  std::__cxx11::string::~string((string *)&local_510);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&iterCount);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&frag);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&vert);
  glu::ShaderProgram::ShaderProgram(this_00,renderCtx,&local_100);
  this->m_program = this_00;
  glu::ProgramSources::~ProgramSources(&local_100);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                  this->m_program);
  if ((this->m_program->m_program).m_info.linkOk != false) {
    this->m_caseIterNdx = 0;
    if (this->m_params->iterCountType != ITERCOUNTTYPE_STATIC) {
      vert.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
           (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
      puVar1 = &vert.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
      std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
      std::operator<<((ostream *)puVar1,"Loop iteration counts in range: [");
      pMVar7 = tcu::MessageBuilder::operator<<
                         ((MessageBuilder *)&vert,&this->m_params->minLoopIterCount);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,", ");
      pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&this->m_params->maxLoopIterCount);
      std::operator<<(&(pMVar7->m_str).super_basic_ostream<char,_std::char_traits<char>_>,"]");
      tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    }
    vert.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
         (_func_int **)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
    puVar1 = &vert.super_basic_ostream<char,_std::char_traits<char>_>.field_0x8;
    std::__cxx11::ostringstream::ostringstream((ostringstream *)puVar1);
    std::operator<<((ostream *)puVar1,"Number of vertices and fragments: ");
    pMVar7 = tcu::MessageBuilder::operator<<
                       ((MessageBuilder *)&vert,&this->m_params->numInvocations);
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)puVar1);
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
               "Pass");
    return extraout_EAX;
  }
  (*(this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode[3])(this);
  this_01 = (TestError *)__cxa_allocate_exception(0x38);
  tcu::TestError::TestError
            (this_01,"Failed to compile shader program",(char *)0x0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sLongRunningShaderTests.cpp"
             ,0xdb);
  __cxa_throw(this_01,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void LongRunningShaderCase::init (void)
{
	DE_ASSERT(!m_program);
	m_program = new glu::ShaderProgram(m_context.getRenderContext(), genSources(*m_params));

	m_testCtx.getLog() << *m_program;

	if (!m_program->isOk())
	{
		deinit();
		TCU_FAIL("Failed to compile shader program");
	}

	m_caseIterNdx = 0;

	if (m_params->iterCountType != ITERCOUNTTYPE_STATIC)
	{
		m_testCtx.getLog() << TestLog::Message << "Loop iteration counts in range: [" << m_params->minLoopIterCount
											   << ", " << m_params->maxLoopIterCount << "]"
						   << TestLog::EndMessage;
	}

	m_testCtx.getLog() << TestLog::Message << "Number of vertices and fragments: " << m_params->numInvocations << TestLog::EndMessage;

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass"); // Test will pass or timeout, unless driver/device crashes.
}